

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[15],_unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long,char_const[15],unsigned_int_const,unsigned_int_const,std::__cxx11::string>
            (uint *args,unsigned_long *args_1,char (*args_2) [15],uint *args_3,uint *args_4,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  longlong lVar1;
  size_t sVar2;
  longlong in_RCX;
  longlong *in_RDX;
  undefined4 *in_RSI;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_long,_char[15],_unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  bool formattable_5;
  bool formattable_pointer_5;
  bool formattable_char_5;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_char_4;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  undefined1 local_1f9;
  char *local_1f8;
  size_t local_1f0;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  char *local_1d8 [4];
  undefined1 *local_1b8;
  basic_string_view<char> local_1b0;
  char **local_1a0;
  basic_string_view<char> local_198;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_178 [8];
  size_t local_170;
  longlong local_168;
  undefined1 *local_160;
  longlong local_158;
  undefined1 *local_150;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  longlong local_138;
  size_t local_130;
  undefined4 local_124;
  undefined1 *local_120;
  undefined4 local_114;
  longlong *local_110;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  longlong local_f8;
  size_t local_f0;
  undefined4 local_e4;
  undefined1 *local_e0;
  undefined4 local_d4;
  longlong *local_d0;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  longlong local_b8;
  size_t local_b0;
  undefined4 local_9c;
  undefined1 *local_98;
  undefined4 local_8c;
  longlong *local_88;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_38 [8];
  size_t local_30;
  undefined1 *local_18;
  undefined1 *local_8;
  
  local_141 = 1;
  local_142 = 1;
  local_143 = 1;
  local_124 = *in_RSI;
  local_120 = &local_144;
  local_110 = &local_138;
  local_138._0_4_ = local_124;
  local_181 = 1;
  local_182 = 1;
  local_183 = 1;
  lVar1 = *in_RDX;
  local_160 = &local_184;
  local_150 = local_178;
  local_41 = 1;
  local_42 = 1;
  local_43 = 1;
  local_18 = &local_44;
  local_8 = local_38;
  local_c1 = 1;
  local_c2 = 1;
  local_c3 = 1;
  local_9c = *in_R8;
  local_98 = &local_c4;
  local_88 = &local_b8;
  local_b8._0_4_ = local_9c;
  local_101 = 1;
  local_102 = 1;
  local_103 = 1;
  local_e4 = *in_R9;
  local_e0 = &local_104;
  local_d0 = &local_f8;
  local_f8._0_4_ = local_e4;
  local_1e1 = 1;
  local_1e2 = 1;
  local_1e3 = 1;
  local_1b8 = &local_1f9;
  local_168 = lVar1;
  local_158 = lVar1;
  local_114 = local_124;
  local_d4 = local_e4;
  local_8c = local_9c;
  local_1b0 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2e3556);
  local_1f8 = local_1b0.data_;
  local_1f0 = local_1b0.size_;
  local_198.data_ = local_1b0.data_;
  local_198.size_ = local_1b0.size_;
  local_1a0 = local_1d8;
  local_1d8[0] = basic_string_view<char>::data(&local_198);
  sVar2 = basic_string_view<char>::size(&local_198);
  (in_RDI->data_).args_[0].field_0.long_long_value = local_138;
  (in_RDI->data_).args_[0].field_0.string.size = local_130;
  (in_RDI->data_).args_[1].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[1].field_0.string.size = local_170;
  (in_RDI->data_).args_[2].field_0.long_long_value = in_RCX;
  (in_RDI->data_).args_[2].field_0.string.size = local_30;
  (in_RDI->data_).args_[3].field_0.long_long_value = local_b8;
  (in_RDI->data_).args_[3].field_0.string.size = local_b0;
  (in_RDI->data_).args_[4].field_0.long_long_value = local_f8;
  (in_RDI->data_).args_[4].field_0.string.size = local_f0;
  (in_RDI->data_).args_[5].field_0.string.data = local_1d8[0];
  (in_RDI->data_).args_[5].field_0.string.size = sVar2;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}